

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O3

void __thiscall Fl_Shared_Image::update(Fl_Shared_Image *this)

{
  int iVar1;
  Fl_Image *pFVar2;
  
  pFVar2 = this->image_;
  if (pFVar2 != (Fl_Image *)0x0) {
    iVar1 = pFVar2->h_;
    (this->super_Fl_Image).w_ = pFVar2->w_;
    (this->super_Fl_Image).h_ = iVar1;
    (this->super_Fl_Image).d_ = pFVar2->d_;
    iVar1 = pFVar2->count_;
    (this->super_Fl_Image).data_ = pFVar2->data_;
    (this->super_Fl_Image).count_ = iVar1;
  }
  return;
}

Assistant:

void
Fl_Shared_Image::update() {
  if (image_) {
    w(image_->w());
    h(image_->h());
    d(image_->d());
    data(image_->data(), image_->count());
  }
}